

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O0

void __thiscall
randomx::AssemblyGeneratorX86::h_FADD_R(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  ostream *poVar1;
  Instruction *in_RSI;
  AssemblyGeneratorX86 *in_RDI;
  
  in_RSI->dst = in_RSI->dst % 4;
  in_RSI->src = in_RSI->src % 4;
  poVar1 = std::operator<<((ostream *)&in_RDI->field_0x10,"\taddpd ");
  poVar1 = std::operator<<(poVar1,*(char **)(regF + (ulong)in_RSI->dst * 8));
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,*(char **)(regA + (ulong)in_RSI->src * 8));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  traceflt(in_RDI,in_RSI);
  return;
}

Assistant:

void AssemblyGeneratorX86::h_FADD_R(Instruction& instr, int i) {
		instr.dst %= RegisterCountFlt;
		instr.src %= RegisterCountFlt;
		asmCode << "\taddpd " << regF[instr.dst] << ", " << regA[instr.src] << std::endl;
		traceflt(instr);
	}